

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,Ref func,u32 offset,Ptr *out_trap)

{
  RunResult RVar1;
  u32 local_1c;
  Ref local_18;
  unsigned_long local_10;
  unsigned_long local_8;
  
  local_1c = offset;
  local_18.index = func.index;
  if ((this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    PushCall();
    RVar1 = Trap;
  }
  else {
    local_8 = (long)(this->values_).
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->values_).
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4;
    local_10 = (long)(this->exceptions_).
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->exceptions_).
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref&,unsigned_long,unsigned_long,unsigned_int&,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)this,&local_18,
               &local_8,&local_10,&local_1c,&this->inst_,&this->mod_);
    RVar1 = Ok;
  }
  return RVar1;
}

Assistant:

RunResult Thread::PushCall(Ref func, u32 offset, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  frames_.emplace_back(func, values_.size(), exceptions_.size(), offset, inst_,
                       mod_);
  return RunResult::Ok;
}